

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture2_GetNumComponentsTestRGBA8_UASTC_Test::TestBody
          (ktxTexture2_GetNumComponentsTestRGBA8_UASTC_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ktx_uint32_t components;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ktxBasisParams cparams;
  ktx_error_code_e result;
  ktxTexture2 *texture;
  char (*in_stack_fffffffffffffe18) [37];
  AssertionResult *in_stack_fffffffffffffe20;
  Message *in_stack_fffffffffffffe28;
  Message *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  int line;
  Message *in_stack_fffffffffffffe40;
  Type type;
  AssertHelper *in_stack_fffffffffffffe50;
  AssertionResult local_198;
  char *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  char *in_stack_fffffffffffffe90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  string local_158 [55];
  undefined1 local_121;
  AssertionResult local_120;
  string local_110 [40];
  char *local_e8;
  undefined1 local_d1;
  AssertionResult local_d0;
  uint local_bc;
  string local_b8 [71];
  undefined1 local_71;
  AssertionResult local_70;
  undefined1 local_60 [4];
  undefined1 local_5c;
  int local_14;
  long local_10 [2];
  
  memset(local_60,0,0x4c);
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_14 = ktxTexture2_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),1,local_10
                         );
    type = (Type)((ulong)in_RDI >> 0x20);
    local_71 = local_14 == 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffe20,(bool *)in_stack_fffffffffffffe18,(type *)0x16126c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffffe98._M_head_impl,in_stack_fffffffffffffe90
                 ,(char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe80);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,(char *)in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(char *)in_stack_fffffffffffffe30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (Message *)in_stack_fffffffffffffe98._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_b8);
      testing::Message::~Message((Message *)0x16132d);
    }
    local_bc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1613d7);
    if (local_bc == 0) {
      local_d1 = local_10[0] != 0;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffffe20,(bool *)in_stack_fffffffffffffe18,(type *)0x161417);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe50);
        in_stack_fffffffffffffe40 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        in_stack_fffffffffffffe38 = (char *)ktxErrorString(local_14);
        local_e8 = in_stack_fffffffffffffe38;
        in_stack_fffffffffffffe30 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe20,(char **)in_stack_fffffffffffffe18);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_fffffffffffffe98._M_head_impl,
                   in_stack_fffffffffffffe90,
                   (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   in_stack_fffffffffffffe80);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe50,type,(char *)in_stack_fffffffffffffe40,
                   (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(char *)in_stack_fffffffffffffe30
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (Message *)in_stack_fffffffffffffe98._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
        std::__cxx11::string::~string(local_110);
        testing::Message::~Message((Message *)0x16153b);
      }
      local_bc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1615e5);
      if (local_bc == 0) {
        local_121 = *(long *)(local_10[0] + 0x70) != 0;
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffe20,(bool *)in_stack_fffffffffffffe18,(type *)0x161629);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe50);
          in_stack_fffffffffffffe28 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe20,
                          (char (*) [22])in_stack_fffffffffffffe18);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)in_stack_fffffffffffffe98._M_head_impl,
                     in_stack_fffffffffffffe90,
                     (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     in_stack_fffffffffffffe80);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe50,type,(char *)in_stack_fffffffffffffe40,
                     (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                     (char *)in_stack_fffffffffffffe30);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (Message *)in_stack_fffffffffffffe98._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
          std::__cxx11::string::~string(local_158);
          testing::Message::~Message((Message *)0x161714);
        }
        local_bc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1617c1);
        if (local_bc == 0) {
          uVar2 = ktxTexture2_GetNumComponents(local_10[0]);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,
                     (uint *)in_stack_fffffffffffffe28,(uint *)in_stack_fffffffffffffe20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe90);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe50);
            in_stack_fffffffffffffe20 =
                 (AssertionResult *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x161851);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe50,type,(char *)in_stack_fffffffffffffe40,
                       (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                       (char *)in_stack_fffffffffffffe30);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffea0),
                       (Message *)in_stack_fffffffffffffe98._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe20);
            testing::Message::~Message((Message *)0x16189f);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x161904);
          local_5c = 1;
          ktxTexture2_CompressBasisEx(local_10[0],local_60);
          ktxTexture2_GetNumComponents(local_10[0]);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,
                     (uint *)in_stack_fffffffffffffe28,(uint *)in_stack_fffffffffffffe20);
          line = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe50);
            testing::AssertionResult::failure_message((AssertionResult *)0x161991);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe50,type,(char *)in_stack_fffffffffffffe40,line,
                       (char *)in_stack_fffffffffffffe30);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffea0),
                       (Message *)in_stack_fffffffffffffe98._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe20);
            testing::Message::~Message((Message *)0x1619dd);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x161a3f);
          if (local_10[0] != 0) {
            (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture2_GetNumComponentsTestRGBA8, UASTC) {
    ktxTexture2* texture;
    KTX_error_code result;
    ktxBasisParams cparams = { };

    if (ktxMemFile != NULL) {
        result = ktxTexture2_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        ktx_uint32_t components = ktxTexture2_GetNumComponents(texture);
        EXPECT_EQ(components, 4U);
        cparams.uastc = KTX_TRUE;
        ktxTexture2_CompressBasisEx(texture, &cparams);
        EXPECT_EQ(components, ktxTexture2_GetNumComponents(texture));
        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));
    }
}